

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

bool __thiscall QFileDialog::restoreState(QFileDialog *this,QByteArray *state)

{
  QFileDialogPrivate *this_00;
  QUrl QVar1;
  char cVar2;
  bool bVar3;
  QDataStream *pQVar4;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *this_01;
  QUrl *this_02;
  long in_FS_OFFSET;
  qint32 viewMode;
  qint32 v;
  qint32 marker;
  QUrl currentDirectory;
  QUrl local_d0;
  QArrayData *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  ViewMode local_ac;
  int local_a8;
  int local_a4;
  QUrl local_a0;
  QArrayDataPointer<QString> local_98;
  QArrayData *local_78;
  char *pcStack_70;
  qsizetype local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  local_78 = &((state->d).d)->super_QArrayData;
  pcStack_70 = (state->d).ptr;
  local_68 = (state->d).size;
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_78->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_78->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,&local_78,1);
  uStack_40 = 0xd;
  cVar2 = QDataStream::atEnd();
  if (cVar2 == '\0') {
    local_98.d = (Data *)0x0;
    local_98.ptr = (QString *)0x0;
    local_98.size = 0;
    this_02 = &local_a0;
    local_a0.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::QUrl(this_02);
    local_a4 = -0x55555556;
    local_a8 = -0x55555556;
    local_ac = 0xaaaaaaaa;
    QDataStream::operator>>((QDataStream *)&local_58,&local_a4);
    QDataStream::operator>>((QDataStream *)&local_58,&local_a8);
    if ((local_a4 == 0xbe) && (0xfffffffd < local_a8 - 5U)) {
      pQVar4 = (QDataStream *)::operator>>((QDataStream *)&local_58,&this_00->splitterState);
      pQVar4 = QtPrivate::readArrayBasedContainer<QList<QUrl>>(pQVar4,&this_00->sidebarUrls);
      QtPrivate::readArrayBasedContainer<QList<QString>>(pQVar4,(QList<QString> *)&local_98);
      if (local_a8 == 3) {
        local_c8 = (QArrayData *)0x0;
        uStack_c0 = 0;
        local_b8 = 0;
        ::operator>>((QDataStream *)&local_58,(QString *)&local_c8);
        QUrl::fromLocalFile((QString *)&local_d0);
        QVar1.d = local_a0.d;
        local_a0.d = local_d0.d;
        local_d0.d = QVar1.d;
        QUrl::~QUrl(&local_d0);
        if (local_c8 != (QArrayData *)0x0) {
          LOCK();
          (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_c8,2,0x10);
          }
        }
      }
      else {
        ::operator>>((QDataStream *)&local_58,&local_a0);
      }
      pQVar4 = (QDataStream *)::operator>>((QDataStream *)&local_58,&this_00->headerData);
      QDataStream::operator>>(pQVar4,(int *)&local_ac);
      this_01 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                 *)QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                   ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                                 *)pQVar4);
      cVar2 = QUrl::isEmpty();
      if (cVar2 == '\0') {
        this_02 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>
                  ::operator()(this_01);
      }
      setDirectoryUrl(this,this_02);
      setViewMode(this,local_ac);
      bVar3 = true;
      if (((this_00->super_QDialogPrivate).nativeDialogInUse == false) &&
         ((this_00->qFileDialogUi).d != (Ui_QFileDialog *)0x0)) {
        bVar3 = QFileDialogPrivate::restoreWidgetState(this_00,(QStringList *)&local_98,-1);
      }
    }
    else {
      bVar3 = false;
    }
    QUrl::~QUrl(&local_a0);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  }
  else {
    bVar3 = false;
  }
  QDataStream::~QDataStream((QDataStream *)&local_58);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDialog::restoreState(const QByteArray &state)
{
    Q_D(QFileDialog);
    QByteArray sd = state;
    QDataStream stream(&sd, QIODevice::ReadOnly);
    stream.setVersion(QDataStream::Qt_5_0);
    if (stream.atEnd())
        return false;
    QStringList history;
    QUrl currentDirectory;
    qint32 marker;
    qint32 v;
    qint32 viewMode;
    stream >> marker;
    stream >> v;
    // the code below only supports versions 3 and 4
    if (marker != QFileDialogMagic || (v != 3 && v != 4))
        return false;

    stream >> d->splitterState
           >> d->sidebarUrls
           >> history;
    if (v == 3) {
        QString currentDirectoryString;
        stream >> currentDirectoryString;
        currentDirectory = QUrl::fromLocalFile(currentDirectoryString);
    } else {
        stream >> currentDirectory;
    }
    stream >> d->headerData
           >> viewMode;

    setDirectoryUrl(lastVisitedDir()->isEmpty() ? currentDirectory : *lastVisitedDir());
    setViewMode(static_cast<QFileDialog::ViewMode>(viewMode));

    if (!d->usingWidgets())
        return true;

    return d->restoreWidgetState(history, -1);
}